

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O0

float __thiscall TransferFunctionITU::encode(TransferFunctionITU *this,float intensity)

{
  long in_RDI;
  float in_XMM0_Da;
  double dVar1;
  float brightness;
  undefined4 local_10;
  
  if (*(float *)(in_RDI + 0x10) <= in_XMM0_Da) {
    dVar1 = std::pow((double)(ulong)(uint)in_XMM0_Da,(double)(ulong)*(uint *)(in_RDI + 0xc));
    local_10 = SUB84(dVar1,0) * 1.099 - 0.099;
  }
  else {
    local_10 = in_XMM0_Da * *(float *)(in_RDI + 0x14);
  }
  return local_10;
}

Assistant:

float encode(const float intensity) const override {
        float brightness;

        if (intensity < linearCutoff_)
            brightness = intensity * linearExpansion_;
        else
            brightness = 1.099f * pow(intensity, oeGamma_) - 0.099f;

        return brightness;
    }